

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::WeightParams::WeightParams(WeightParams *this,WeightParams *from)

{
  InternalMetadata *this_00;
  QuantizationParams *from_00;
  QuantizationParams *this_01;
  undefined8 *puVar1;
  ulong uVar2;
  
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__WeightParams_004b53d8;
  google::protobuf::RepeatedField<float>::RepeatedField(&this->floatvalue_,&from->floatvalue_);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar2 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (this_00,(string *)((uVar2 & 0xfffffffffffffffc) + 8));
  }
  (this->float16value_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (ulong)(from->float16value_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar2 + 8) != 0) {
    puVar1 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->float16value_,uVar2,puVar1);
  }
  (this->rawvalue_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (ulong)(from->rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar2 + 8) != 0) {
    puVar1 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->rawvalue_,uVar2,puVar1);
  }
  (this->int8rawvalue_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (ulong)(from->int8rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar2 + 8) != 0) {
    puVar1 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->int8rawvalue_,uVar2,puVar1);
  }
  from_00 = from->quantization_;
  if (from_00 == (QuantizationParams *)0x0 ||
      from == (WeightParams *)_WeightParams_default_instance_) {
    this_01 = (QuantizationParams *)0x0;
  }
  else {
    this_01 = (QuantizationParams *)operator_new(0x28);
    QuantizationParams::QuantizationParams(this_01,from_00);
  }
  this->quantization_ = this_01;
  this->isupdatable_ = from->isupdatable_;
  return;
}

Assistant:

WeightParams::WeightParams(const WeightParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      floatvalue_(from.floatvalue_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  float16value_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    float16value_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_float16value().empty()) {
    float16value_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_float16value(), 
      GetArenaForAllocation());
  }
  rawvalue_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    rawvalue_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_rawvalue().empty()) {
    rawvalue_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_rawvalue(), 
      GetArenaForAllocation());
  }
  int8rawvalue_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    int8rawvalue_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_int8rawvalue().empty()) {
    int8rawvalue_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_int8rawvalue(), 
      GetArenaForAllocation());
  }
  if (from._internal_has_quantization()) {
    quantization_ = new ::CoreML::Specification::QuantizationParams(*from.quantization_);
  } else {
    quantization_ = nullptr;
  }
  isupdatable_ = from.isupdatable_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.WeightParams)
}